

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyz.h
# Opt level: O2

void __thiscall
chrono::fea::ChNodeFEAxyz::NodeIntStateScatter
          (ChNodeFEAxyz *this,uint off_x,ChState *x,uint off_v,ChStateDelta *v,double T)

{
  ChVector<double> local_78;
  MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
  local_60 [56];
  
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_60,
             &x->super_ChVectorDynamic<double>,(ulong)off_x,3);
  ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            (&local_78,local_60,(type *)0x0);
  if ((ChVector<double> *)&(this->super_ChNodeFEAbase).field_0x20 != &local_78) {
    *(double *)&(this->super_ChNodeFEAbase).field_0x20 = local_78.m_data[0];
    *(double *)&this->field_0x28 = local_78.m_data[1];
    *(double *)&this->field_0x30 = local_78.m_data[2];
  }
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_60,
             &v->super_ChVectorDynamic<double>,(ulong)off_v,3);
  ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            (&local_78,local_60,(type *)0x0);
  if ((ChVector<double> *)&this->field_0x38 != &local_78) {
    *(double *)&this->field_0x38 = local_78.m_data[0];
    *(double *)&this->field_0x40 = local_78.m_data[1];
    *(double *)&this->field_0x48 = local_78.m_data[2];
  }
  return;
}

Assistant:

virtual void NodeIntStateScatter(const unsigned int off_x,
                                     const ChState& x,
                                     const unsigned int off_v,
                                     const ChStateDelta& v,
                                     const double T) override {
        SetPos(x.segment(off_x, 3));
        SetPos_dt(v.segment(off_v, 3));
    }